

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O2

string * __thiscall
flatbuffers::Namer::Variable<flatbuffers::FieldDef>
          (string *__return_storage_ptr__,Namer *this,string *p,FieldDef *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,p,"_");
  std::operator+(&local_60,&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s);
  (*this->_vptr_Namer[0x14])(__return_storage_ptr__,this,&local_60,(ulong)(this->config_).variables)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Variable(const std::string &p, const T &s) const {
    return Format(p + "_" + s.name, config_.variables);
  }